

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O3

char * __thiscall masksearch::search(masksearch *this,char *first,char *last,CallbackType *cb)

{
  pointer ppVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  pointer ppVar5;
  char *p;
  char *pcVar6;
  char *local_40;
  char *local_38;
  
  ppVar5 = (this->patterns).
           super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->patterns).
           super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    do {
      puVar2 = (ppVar5->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar3 = (ppVar5->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar6 = first;
      while ((pcVar6 != last &&
             (pcVar6 = pcVar6 + ((long)(ppVar5->first).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start -
                                (long)(ppVar5->first).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish), pcVar6 != last)))
      {
        local_40 = pcVar6 + ((long)puVar2 - (long)puVar3);
        local_38 = pcVar6;
        if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar4 = (*cb->_M_invoker)((_Any_data *)cb,&local_38,&local_40);
        pcVar6 = pcVar6 + 1;
        if (!bVar4) {
          return (char *)0x0;
        }
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  return last;
}

Assistant:

const char *search(const char *first, const char *last, CallbackType cb)
    {
        for (auto& bm : patterns)
        {
            auto size = bm.first.size();

            auto p = first;
            while (p != last) {
                auto f = maskedsearch(p, last, bm);
                if (f == last)
                    break;
                if (!cb((const char*)f, (const char*)f + size))
                    return NULL;
                p = f + 1;
            }
        }
        return last;
    }